

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.c
# Opt level: O0

void test_flush(Byte *compr,uLong *comprLen)

{
  uint uVar1;
  size_t sVar2;
  uInt len;
  int err;
  z_stream c_stream;
  uLong *comprLen_local;
  Byte *compr_local;
  
  c_stream.reserved = (uLong)comprLen;
  sVar2 = strlen(hello);
  c_stream.state = (internal_state *)zalloc;
  c_stream.zalloc = (alloc_func)zfree;
  c_stream.zfree = (free_func)0x0;
  uVar1 = deflateInit_(&len,0xffffffff,"1.2.11",0x70);
  if (uVar1 != 0) {
    fprintf(_stderr,"%s error: %d\n","deflateInit",(ulong)uVar1);
    exit(1);
  }
  _len = hello;
  c_stream.next_in._0_4_ = 3;
  c_stream.next_out._0_4_ = (undefined4)*(undefined8 *)c_stream.reserved;
  c_stream.total_in = (uLong)compr;
  uVar1 = deflate(&len,3);
  if (uVar1 == 0) {
    compr[3] = compr[3] + '\x01';
    c_stream.next_in._0_4_ = (int)sVar2 + -2;
    uVar1 = deflate(&len,4);
    if ((uVar1 != 1) && (uVar1 != 0)) {
      fprintf(_stderr,"%s error: %d\n","deflate",(ulong)uVar1);
      exit(1);
    }
    uVar1 = deflateEnd(&len);
    if (uVar1 == 0) {
      *(undefined8 *)c_stream.reserved = c_stream._32_8_;
      return;
    }
    fprintf(_stderr,"%s error: %d\n","deflateEnd",(ulong)uVar1);
    exit(1);
  }
  fprintf(_stderr,"%s error: %d\n","deflate",(ulong)uVar1);
  exit(1);
}

Assistant:

void test_flush(compr, comprLen)
    Byte *compr;
    uLong *comprLen;
{
    z_stream c_stream; /* compression stream */
    int err;
    uInt len = (uInt)strlen(hello)+1;

    c_stream.zalloc = zalloc;
    c_stream.zfree = zfree;
    c_stream.opaque = (voidpf)0;

    err = deflateInit(&c_stream, Z_DEFAULT_COMPRESSION);
    CHECK_ERR(err, "deflateInit");

    c_stream.next_in  = (z_const unsigned char *)hello;
    c_stream.next_out = compr;
    c_stream.avail_in = 3;
    c_stream.avail_out = (uInt)*comprLen;
    err = deflate(&c_stream, Z_FULL_FLUSH);
    CHECK_ERR(err, "deflate");

    compr[3]++; /* force an error in first compressed block */
    c_stream.avail_in = len - 3;

    err = deflate(&c_stream, Z_FINISH);
    if (err != Z_STREAM_END) {
        CHECK_ERR(err, "deflate");
    }
    err = deflateEnd(&c_stream);
    CHECK_ERR(err, "deflateEnd");

    *comprLen = c_stream.total_out;
}